

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_size_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::
GeneratedMessageTest_EmptyMessageWithExtensionsSize_Test::
GeneratedMessageTest_EmptyMessageWithExtensionsSize_Test
          (GeneratedMessageTest_EmptyMessageWithExtensionsSize_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0164db08;
  return;
}

Assistant:

TEST(GeneratedMessageTest, EmptyMessageWithExtensionsSize) {
  struct MockGenerated : public MockMessageBase {  // 16 bytes
    MockExtensionSet extensions;                   // 24 bytes
    int cached_size;                               // 4 bytes
    PROTOBUF_TSAN_DECLARE_MEMBER;                  // 0-4 bytes
    // + 0-4 bytes of padding
  };
  ABSL_CHECK_MESSAGE_SIZE(MockGenerated, 48);
  EXPECT_EQ(sizeof(proto2_unittest::TestEmptyMessageWithExtensions),
            sizeof(MockGenerated));
}